

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  IMathService *__tmp;
  IMathService *instance;
  IMathService *__tmp_1;
  float fVar4;
  shared_ptr<IMathService> mathService;
  ServiceLocator locator;
  undefined1 local_d8 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined4 local_ac;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  ServiceLocator local_88;
  
  ServiceLocator::ServiceLocator(&local_88);
  instance = (IMathService *)operator_new(0x10);
  instance->_vptr_IMathService = (_func_int **)0x0;
  instance[1]._vptr_IMathService = (_func_int **)0x0;
  instance->_vptr_IMathService = (_func_int **)&PTR__IMathService_00106c38;
  ServiceLocator::registerInstance<IMathService>(&local_88,instance);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)(local_d8 + 0x18));
  if ((long *)local_d8._24_8_ == (long *)0x0) {
    __assert_fail("mathService",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x24,"int main()");
  }
  local_d8._0_4_ = 0x41200000;
  local_ac = 0x41a00000;
  fVar4 = (float)(**(code **)(*(long *)local_d8._24_8_ + 0x10))();
  if ((fVar4 != 30.0) || (NAN(fVar4))) {
    __assert_fail("mathService->add(10, 20) == 30",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x25,"int main()");
  }
  local_d8._0_4_ = 0x41f00000;
  local_ac = 0x41200000;
  fVar4 = (float)(**(code **)(*(long *)local_d8._24_8_ + 0x18))();
  if ((fVar4 != 20.0) || (NAN(fVar4))) {
    __assert_fail("mathService->subtract(30, 10) == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x26,"int main()");
  }
  local_d8._0_4_ = 0x40000000;
  local_ac = 0x40200000;
  fVar4 = (float)(**(code **)(*(long *)local_d8._24_8_ + 0x20))();
  if ((fVar4 != 5.0) || (NAN(fVar4))) {
    __assert_fail("mathService->multiply(2, 2.5) == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x27,"int main()");
  }
  local_d8._0_4_ = 0x41f00000;
  local_ac = 0x41200000;
  fVar4 = (float)(**(code **)(*(long *)local_d8._24_8_ + 0x28))();
  p_Var3 = local_b8;
  if ((fVar4 != 3.0) || (NAN(fVar4))) {
    __assert_fail("mathService->divide(30, 10) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x28,"int main()");
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
    }
  }
  if ((int)*(long *)(local_d8._24_8_ + 8) != 0) {
    __assert_fail("test->state == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x2c,"int main()");
  }
  *(undefined4 *)(local_d8._24_8_ + 8) = 1;
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_d8);
  uVar2 = local_d8._8_8_;
  uVar1 = local_d8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
    }
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if (*(int *)(uVar1 + 8) != 1) {
    __assert_fail("test->state == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x2f,"int main()");
  }
  ServiceLocator::clear(&local_88);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_d8);
  p_Var3 = local_b8;
  local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._24_8_ = local_d8._0_8_;
  local_d8._0_8_ = (__buckets_ptr)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((__buckets_ptr)local_d8._24_8_ != (__buckets_ptr)0x0) {
    __assert_fail("!mathService",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x36,"int main()");
  }
  local_a8._M_unused._M_object = (__node_base_ptr)0x0;
  local_a8._8_8_ = (__buckets_ptr)0x0;
  local_90 = std::
             _Function_handler<std::shared_ptr<IMathService>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp:59:40)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<std::shared_ptr<IMathService>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp:59:40)>
             ::_M_manager;
  ServiceLocator::registerCreator<IMathService>
            (&local_88,(function<std::shared_ptr<IMathService>_()> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_d8);
  p_Var3 = local_b8;
  local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  local_d8._24_8_ = local_d8._0_8_;
  local_d8._0_8_ = (__buckets_ptr)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  p_Var3 = local_b8;
  uVar1 = local_d8._24_8_;
  if ((__buckets_ptr)local_d8._24_8_ != (__buckets_ptr)0x0) {
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    if (*(int *)(uVar1 + 8) != 0) {
      __assert_fail("test->state == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                    ,0x42,"int main()");
    }
    *(undefined4 *)(uVar1 + 8) = 1;
    ServiceLocator::resolve<IMathService>((ServiceLocator *)local_d8);
    uVar2 = local_d8._8_8_;
    uVar1 = local_d8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if (*(int *)(uVar1 + 8) != 0) {
      __assert_fail("test->state == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                    ,0x46,"int main()");
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    ServiceLocator::~ServiceLocator(&local_88);
    return 0;
  }
  __assert_fail("mathService",
                "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                ,0x3e,"int main()");
}

Assistant:

int main()
{
	ServiceLocator locator;

	//Single instance creation => everytime "resolve" gets called the same instance will be returned
	locator.registerInstance<IMathService>(new MathService());

	auto mathService = locator.resolve<IMathService>();
	assert(mathService);
	assert(mathService->add(10, 20) == 30);
	assert(mathService->subtract(30, 10) == 20);
	assert(mathService->multiply(2, 2.5) == 5);
	assert(mathService->divide(30, 10) == 3);

	//simple check if it's really the same instance
	auto test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;
	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 1);


	//explicit clear of all instances
	locator.clear();
	//there should be no IMathService anymore
	mathService = locator.resolve<IMathService>();
	assert(!mathService);


	//you can create lazy instances with a delegate which returns a shared ptr
	//the instance will be created everytime the "resolve" method gets called
	locator.registerCreator<IMathService>([]() { return std::make_shared<MathService>(); });
	
	mathService = locator.resolve<IMathService>();
	assert(mathService);

	//same check as above but this time changing the state and resolving the service should return an other instance
	test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;

	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 0);

	return 0;
}